

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser.cc
# Opt level: O0

bool __thiscall tinyusdz::ascii::AsciiParser::LexFloat(AsciiParser *this,string *result)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  string local_710 [32];
  string local_6f0;
  ostringstream local_6d0 [8];
  ostringstream ss_e_2;
  string local_558;
  ostringstream local_538 [8];
  ostringstream ss_e_1;
  string local_3b8 [7];
  bool has_exp_sign;
  string local_398 [32];
  string local_378 [39];
  char local_351;
  undefined1 local_350 [7];
  char curr;
  ostringstream local_330 [8];
  ostringstream ss_e;
  char local_1b1 [6];
  char local_1ab;
  byte local_1aa;
  char c;
  stringstream local_1a8 [5];
  char sc;
  bool leading_decimal_dots;
  bool has_sign;
  stringstream ss;
  ostream aoStack_198 [376];
  string *local_20;
  string *result_local;
  AsciiParser *this_local;
  
  local_20 = result;
  result_local = (string *)this;
  ::std::__cxx11::stringstream::stringstream(local_1a8);
  c = '\0';
  local_1aa = 0;
  bVar1 = Char1(this,&local_1ab);
  if (!bVar1) {
    this_local._7_1_ = 0;
    local_1b1[1] = '\x01';
    local_1b1[2] = '\0';
    local_1b1[3] = '\0';
    local_1b1[4] = '\0';
    goto LAB_0055ed51;
  }
  (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
  if ((local_1ab == '+') || (local_1ab == '-')) {
    ::std::operator<<(aoStack_198,local_1ab);
    c = '\x01';
    bVar1 = Char1(this,local_1b1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_1b1[1] = '\x01';
      local_1b1[2] = '\0';
      local_1b1[3] = '\0';
      local_1b1[4] = '\0';
      goto LAB_0055ed51;
    }
    if (local_1b1[0] == '.') {
      local_1aa = 1;
      (this->_curr_cursor).col = (this->_curr_cursor).col + 1;
      ::std::operator<<(aoStack_198,'.');
    }
    else {
      StreamReader::seek_from_current(this->_sr,-1);
    }
  }
  else if ((local_1ab < '0') || ('9' < local_1ab)) {
    if (local_1ab != '.') {
      ::std::__cxx11::ostringstream::ostringstream(local_330);
      poVar3 = ::std::operator<<((ostream *)local_330,"[error]");
      poVar3 = ::std::operator<<(poVar3,
                                 "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                );
      poVar3 = ::std::operator<<(poVar3,":");
      poVar3 = ::std::operator<<(poVar3,"LexFloat");
      poVar3 = ::std::operator<<(poVar3,"():");
      poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb32);
      ::std::operator<<(poVar3," ");
      poVar3 = ::std::operator<<((ostream *)local_330,"Sign or `.` or 0-9 expected.");
      ::std::operator<<(poVar3,"\n");
      ::std::__cxx11::ostringstream::str();
      PushError(this,(string *)local_350);
      ::std::__cxx11::string::~string((string *)local_350);
      this_local._7_1_ = 0;
      local_1b1[1] = '\x01';
      local_1b1[2] = '\0';
      local_1b1[3] = '\0';
      local_1b1[4] = '\0';
      ::std::__cxx11::ostringstream::~ostringstream(local_330);
      goto LAB_0055ed51;
    }
    local_1aa = 1;
    bVar1 = Rewind(this,1);
    if (!bVar1) {
      this_local._7_1_ = 0;
      local_1b1[1] = '\x01';
      local_1b1[2] = '\0';
      local_1b1[3] = '\0';
      local_1b1[4] = '\0';
      goto LAB_0055ed51;
    }
    (this->_curr_cursor).col = (this->_curr_cursor).col + -1;
  }
  else {
    ::std::operator<<(aoStack_198,local_1ab);
  }
  if ((local_1aa & 1) == 0) {
    while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
      bVar1 = Char1(this,&local_351);
      if (!bVar1) {
        this_local._7_1_ = 0;
        local_1b1[1] = '\x01';
        local_1b1[2] = '\0';
        local_1b1[3] = '\0';
        local_1b1[4] = '\0';
        goto LAB_0055ed51;
      }
      if ((local_351 < '0') || ('9' < local_351)) {
        StreamReader::seek_from_current(this->_sr,-1);
        break;
      }
      ::std::operator<<(aoStack_198,local_351);
    }
  }
  bVar1 = Eof(this);
  if (bVar1) {
    ::std::__cxx11::stringstream::str();
    ::std::__cxx11::string::operator=((string *)local_20,local_378);
    ::std::__cxx11::string::~string(local_378);
    this_local._7_1_ = 1;
    local_1b1[1] = '\x01';
    local_1b1[2] = '\0';
    local_1b1[3] = '\0';
    local_1b1[4] = '\0';
  }
  else {
    bVar1 = Char1(this,&local_351);
    if (bVar1) {
      if (local_351 == '.') {
        ::std::operator<<(aoStack_198,'.');
        while (bVar1 = Eof(this), ((bVar1 ^ 0xffU) & 1) != 0) {
          bVar1 = Char1(this,&local_351);
          if (!bVar1) {
            this_local._7_1_ = 0;
            local_1b1[1] = '\x01';
            local_1b1[2] = '\0';
            local_1b1[3] = '\0';
            local_1b1[4] = '\0';
            goto LAB_0055ed51;
          }
          if ((local_351 < '0') || ('9' < local_351)) break;
          ::std::operator<<(aoStack_198,local_351);
        }
      }
      else if ((local_351 != 'e') && (local_351 != 'E')) {
        ::std::__cxx11::stringstream::str();
        ::std::__cxx11::string::operator=((string *)local_20,local_398);
        ::std::__cxx11::string::~string(local_398);
        StreamReader::seek_from_current(this->_sr,-1);
        this_local._7_1_ = 1;
        local_1b1[1] = '\x01';
        local_1b1[2] = '\0';
        local_1b1[3] = '\0';
        local_1b1[4] = '\0';
        goto LAB_0055ed51;
      }
      bVar1 = Eof(this);
      if (bVar1) {
        ::std::__cxx11::stringstream::str();
        ::std::__cxx11::string::operator=((string *)local_20,local_3b8);
        ::std::__cxx11::string::~string(local_3b8);
        this_local._7_1_ = 1;
        local_1b1[1] = '\x01';
        local_1b1[2] = '\0';
        local_1b1[3] = '\0';
        local_1b1[4] = '\0';
      }
      else {
        bVar1 = false;
        if ((local_351 == 'e') || (local_351 == 'E')) {
          ::std::operator<<(aoStack_198,local_351);
          bVar2 = Char1(this,&local_351);
          if (!bVar2) {
            this_local._7_1_ = 0;
            local_1b1[1] = '\x01';
            local_1b1[2] = '\0';
            local_1b1[3] = '\0';
            local_1b1[4] = '\0';
            goto LAB_0055ed51;
          }
          if ((local_351 == '+') || (local_351 == '-')) {
            ::std::operator<<(aoStack_198,local_351);
            bVar1 = true;
          }
          else {
            if ((local_351 < '0') || ('9' < local_351)) {
              ::std::__cxx11::ostringstream::ostringstream(local_538);
              poVar3 = ::std::operator<<((ostream *)local_538,"[error]");
              poVar3 = ::std::operator<<(poVar3,
                                         "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                        );
              poVar3 = ::std::operator<<(poVar3,":");
              poVar3 = ::std::operator<<(poVar3,"LexFloat");
              poVar3 = ::std::operator<<(poVar3,"():");
              poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb8a);
              ::std::operator<<(poVar3," ");
              poVar3 = ::std::operator<<((ostream *)local_538,"Empty `E\' is not allowed.");
              ::std::operator<<(poVar3,"\n");
              ::std::__cxx11::ostringstream::str();
              PushError(this,&local_558);
              ::std::__cxx11::string::~string((string *)&local_558);
              this_local._7_1_ = 0;
              local_1b1[1] = '\x01';
              local_1b1[2] = '\0';
              local_1b1[3] = '\0';
              local_1b1[4] = '\0';
              ::std::__cxx11::ostringstream::~ostringstream(local_538);
              goto LAB_0055ed51;
            }
            ::std::operator<<(aoStack_198,local_351);
          }
          while (bVar2 = Eof(this), ((bVar2 ^ 0xffU) & 1) != 0) {
            bVar2 = Char1(this,&local_351);
            if (!bVar2) {
              this_local._7_1_ = 0;
              local_1b1[1] = '\x01';
              local_1b1[2] = '\0';
              local_1b1[3] = '\0';
              local_1b1[4] = '\0';
              goto LAB_0055ed51;
            }
            if ((local_351 < '0') || ('9' < local_351)) {
              if ((local_351 != '+') && (local_351 != '-')) {
                StreamReader::seek_from_current(this->_sr,-1);
                break;
              }
              if (bVar1) {
                ::std::__cxx11::ostringstream::ostringstream(local_6d0);
                poVar3 = ::std::operator<<((ostream *)local_6d0,"[error]");
                poVar3 = ::std::operator<<(poVar3,
                                           "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/ascii-parser.cc"
                                          );
                poVar3 = ::std::operator<<(poVar3,":");
                poVar3 = ::std::operator<<(poVar3,"LexFloat");
                poVar3 = ::std::operator<<(poVar3,"():");
                poVar3 = (ostream *)::std::ostream::operator<<(poVar3,0xb99);
                ::std::operator<<(poVar3," ");
                poVar3 = ::std::operator<<((ostream *)local_6d0,
                                           "No multiple exponential sign characters.");
                ::std::operator<<(poVar3,"\n");
                ::std::__cxx11::ostringstream::str();
                PushError(this,&local_6f0);
                ::std::__cxx11::string::~string((string *)&local_6f0);
                this_local._7_1_ = 0;
                local_1b1[1] = '\x01';
                local_1b1[2] = '\0';
                local_1b1[3] = '\0';
                local_1b1[4] = '\0';
                ::std::__cxx11::ostringstream::~ostringstream(local_6d0);
                goto LAB_0055ed51;
              }
              ::std::operator<<(aoStack_198,local_351);
              bVar1 = true;
            }
            else {
              ::std::operator<<(aoStack_198,local_351);
            }
          }
        }
        else {
          StreamReader::seek_from_current(this->_sr,-1);
        }
        ::std::__cxx11::stringstream::str();
        ::std::__cxx11::string::operator=((string *)local_20,local_710);
        ::std::__cxx11::string::~string(local_710);
        this_local._7_1_ = 1;
        local_1b1[1] = '\x01';
        local_1b1[2] = '\0';
        local_1b1[3] = '\0';
        local_1b1[4] = '\0';
      }
    }
    else {
      this_local._7_1_ = 0;
      local_1b1[1] = '\x01';
      local_1b1[2] = '\0';
      local_1b1[3] = '\0';
      local_1b1[4] = '\0';
    }
  }
LAB_0055ed51:
  ::std::__cxx11::stringstream::~stringstream(local_1a8);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool AsciiParser::LexFloat(std::string *result) {
  // FLOATVAL : ('+' or '-')? FLOAT
  // FLOAT
  //     :   ('0'..'9')+ '.' ('0'..'9')* EXPONENT?
  //     |   '.' ('0'..'9')+ EXPONENT?
  //     |   ('0'..'9')+ EXPONENT
  //     ;
  // EXPONENT : ('e'|'E') ('+'|'-')? ('0'..'9')+ ;

  std::stringstream ss;

  bool has_sign{false};
  bool leading_decimal_dots{false};
  {
    char sc;
    if (!Char1(&sc)) {
      return false;
    }
    _curr_cursor.col++;

    // sign, '.' or [0-9]
    if ((sc == '+') || (sc == '-')) {
      ss << sc;
      has_sign = true;

      char c;
      if (!Char1(&c)) {
        return false;
      }

      if (c == '.') {
        // ok. something like `+.7`, `-.53`
        leading_decimal_dots = true;
        _curr_cursor.col++;
        ss << c;

      } else {
        // unwind and continue
        _sr->seek_from_current(-1);
      }

    } else if ((sc >= '0') && (sc <= '9')) {
      // ok
      ss << sc;
    } else if (sc == '.') {
      // ok but rescan again in 2.
      leading_decimal_dots = true;
      if (!Rewind(1)) {
        return false;
      }
      _curr_cursor.col--;
    } else {
      PUSH_ERROR_AND_RETURN("Sign or `.` or 0-9 expected.");
    }
  }

  (void)has_sign;

  // 1. Read the integer part
  char curr;
  if (!leading_decimal_dots) {
    // std::cout << "1 read int part: ss = " << ss.str() << "\n";

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      // std::cout << "1 curr = " << curr << "\n";
      if ((curr >= '0') && (curr <= '9')) {
        // continue
        ss << curr;
      } else {
        _sr->seek_from_current(-1);
        break;
      }
    }
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  if (!Char1(&curr)) {
    return false;
  }

  // std::cout << "before 2: ss = " << ss.str() << ", curr = " << curr <<
  // "\n";

  // 2. Read the decimal part
  if (curr == '.') {
    ss << curr;

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        ss << curr;
      } else {
        break;
      }
    }

  } else if ((curr == 'e') || (curr == 'E')) {
    // go to 3.
  } else {
    // end
    (*result) = ss.str();
    _sr->seek_from_current(-1);
    return true;
  }

  if (Eof()) {
    (*result) = ss.str();
    return true;
  }

  // 3. Read the exponent part
  bool has_exp_sign{false};
  if ((curr == 'e') || (curr == 'E')) {
    ss << curr;

    if (!Char1(&curr)) {
      return false;
    }

    if ((curr == '+') || (curr == '-')) {
      // exp sign
      ss << curr;
      has_exp_sign = true;

    } else if ((curr >= '0') && (curr <= '9')) {
      // ok
      ss << curr;
    } else {
      // Empty E is not allowed.
      PUSH_ERROR_AND_RETURN("Empty `E' is not allowed.");
    }

    while (!Eof()) {
      if (!Char1(&curr)) {
        return false;
      }

      if ((curr >= '0') && (curr <= '9')) {
        // ok
        ss << curr;

      } else if ((curr == '+') || (curr == '-')) {
        if (has_exp_sign) {
          // No multiple sign characters
          PUSH_ERROR_AND_RETURN("No multiple exponential sign characters.");
        }

        ss << curr;
        has_exp_sign = true;
      } else {
        // end
        _sr->seek_from_current(-1);
        break;
      }
    }
  } else {
    _sr->seek_from_current(-1);
  }

  (*result) = ss.str();
  return true;
}